

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O0

void mmu_handle_skey(uc_struct *uc,target_ulong addr,int rw,int *flags)

{
  int iVar1;
  byte local_39;
  int rc;
  uint8_t key;
  S390SKeysClass *skeyclass;
  S390SKeysState *ss;
  int *flags_local;
  target_ulong tStack_18;
  int rw_local;
  target_ulong addr_local;
  uc_struct *uc_local;
  
  skeyclass = (S390SKeysClass *)(uc->cpu[1].tb_jmp_cache + 0x1f9);
  _rc = uc->cpu[1].tb_jmp_cache[0x1fc];
  ss = (S390SKeysState *)flags;
  flags_local._4_4_ = rw;
  tStack_18 = addr;
  addr_local = (target_ulong)uc;
  iVar1 = (*(code *)_rc->cs_base)(skeyclass,addr >> 0xc,1,&local_39);
  if (iVar1 != 0) {
    return;
  }
  if (flags_local._4_4_ != 0) {
    if (flags_local._4_4_ == 1) {
      local_39 = local_39 | 2;
      goto LAB_01255321;
    }
    if (flags_local._4_4_ != 2) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/mmu_helper.c"
                 ,0x153,(char *)0x0);
    }
  }
  if ((local_39 & 2) == 0) {
    *(uint *)ss = *(uint *)ss & 0xfffffffd;
  }
LAB_01255321:
  local_39 = local_39 | 4;
  (**(code **)&_rc->flags)(skeyclass,tStack_18 >> 0xc,1,&local_39);
  return;
}

Assistant:

static void mmu_handle_skey(uc_engine *uc, target_ulong addr, int rw, int *flags)
{ 
    S390SKeysState *ss = (S390SKeysState *)(&((S390CPU *)uc->cpu)->ss);
    S390SKeysClass *skeyclass = S390_SKEYS_GET_CLASS(ss);
    uint8_t key;
    int rc;

#if 0
    if (unlikely(addr >= ram_size)) {
        return;
    }
#endif

    /*
     * Whenever we create a new TLB entry, we set the storage key reference
     * bit. In case we allow write accesses, we set the storage key change
     * bit. Whenever the guest changes the storage key, we have to flush the
     * TLBs of all CPUs (the whole TLB or all affected entries), so that the
     * next reference/change will result in an MMU fault and make us properly
     * update the storage key here.
     *
     * Note 1: "record of references ... is not necessarily accurate",
     *         "change bit may be set in case no storing has occurred".
     *         -> We can set reference/change bits even on exceptions.
     * Note 2: certain accesses seem to ignore storage keys. For example,
     *         DAT translation does not set reference bits for table accesses.
     *
     * TODO: key-controlled protection. Only CPU accesses make use of the
     *       PSW key. CSS accesses are different - we have to pass in the key.
     *
     * TODO: we have races between getting and setting the key.
     */
    rc = skeyclass->get_skeys(ss, addr / TARGET_PAGE_SIZE, 1, &key);
    if (rc) {
        // trace_get_skeys_nonzero(rc);
        return;
    }

    switch (rw) {
    case MMU_DATA_LOAD:
    case MMU_INST_FETCH:
        /*
         * The TLB entry has to remain write-protected on read-faults if
         * the storage key does not indicate a change already. Otherwise
         * we might miss setting the change bit on write accesses.
         */
        if (!(key & SK_C)) {
            *flags &= ~PAGE_WRITE;
        }
        break;
    case MMU_DATA_STORE:
        key |= SK_C;
        break;
    default:
        g_assert_not_reached();
    }

    /* Any store/fetch sets the reference bit */
    key |= SK_R;

    rc = skeyclass->set_skeys(ss, addr / TARGET_PAGE_SIZE, 1, &key);
    if (rc) {
        // trace_set_skeys_nonzero(rc);
    }
}